

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
uintwide_t(uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          char *str_input)

{
  uint uVar1;
  pointer pvVar2;
  bool bVar3;
  allocator_type local_29;
  undefined **local_28;
  size_type local_20;
  pointer local_18;
  
  local_28 = (undefined **)((ulong)local_28 & 0xffffffff00000000);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this,
             0x160,(const_reference)&local_28,&local_29);
  (this->values).super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020ac08;
  memset((this->values).
         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,0,
         0x580);
  bVar3 = rd_string(this,str_input,0xffffffffffffffff,0);
  if (!bVar3) {
    limits_helper_max<false>();
    uVar1 = (this->values).
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elem_count;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         local_20;
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         local_18;
    local_28 = &PTR__dynamic_array_002087f0;
    if ((ulong)uVar1 != 0) {
      local_20 = uVar1;
      local_18 = pvVar2;
      operator_delete(pvVar2,(ulong)uVar1 << 2);
    }
  }
  return;
}

Assistant:

constexpr uintwide_t(const char* str_input) // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
      : values
        {
          static_cast<typename representation_type::size_type>(number_of_limbs),
          static_cast<typename representation_type::value_type>(UINT8_C(0)),
          typename representation_type::allocator_type()
        }
    {
      if(!rd_string(str_input, (std::numeric_limits<unsigned_fast_type>::max)(), 0))
      {
        static_cast<void>(operator=((std::numeric_limits<uintwide_t>::max)()));
      }
    }